

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O2

void google::protobuf::compiler::WriteShort(CodedOutputStream *out,uint16_t val)

{
  uint8_t p [2];
  
  io::CodedOutputStream::WriteRaw(out,p,2);
  return;
}

Assistant:

static void WriteShort(io::CodedOutputStream* out, uint16_t val) {
  uint8_t p[2];
  p[0] = static_cast<uint8_t>(val);
  p[1] = static_cast<uint8_t>(val >> 8);
  out->WriteRaw(p, 2);
}